

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void ncnn::dequantize_int32_to_float32
               (Mat *m,float scale,float *bias,int bias_data_size,Option *opt)

{
  Layer *pLVar1;
  Mat local_9b8;
  Mat weights [1];
  ParamDict pd;
  
  pLVar1 = create_layer(0x3a);
  ParamDict::ParamDict(&pd);
  ParamDict::set(&pd,0,scale);
  ParamDict::set(&pd,1,(uint)(bias != (float *)0x0));
  ParamDict::set(&pd,2,bias_data_size);
  (*pLVar1->_vptr_Layer[2])(pLVar1,&pd);
  weights[0].elemsize._0_4_ = 0;
  weights[0]._20_8_ = 0;
  weights[0].data = (void *)0x0;
  weights[0].refcount._0_4_ = 0;
  weights[0].refcount._4_4_ = 0;
  local_9b8.refcount = (int *)0x0;
  local_9b8.elemsize = 4;
  local_9b8.allocator = (Allocator *)0x0;
  weights[0].allocator = (Allocator *)0x0;
  weights[0].dims = 0;
  weights[0].w = 0;
  weights[0].h = 0;
  weights[0].c = 0;
  weights[0].cstep = 0;
  local_9b8.h = 1;
  local_9b8.c = 1;
  local_9b8.cstep = (size_t)bias_data_size;
  local_9b8.data = bias;
  local_9b8.elempack = 1;
  local_9b8.dims = 1;
  local_9b8.w = bias_data_size;
  Mat::operator=(weights,&local_9b8);
  Mat::~Mat(&local_9b8);
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_9b8,weights);
  (*pLVar1->_vptr_Layer[3])(pLVar1,&local_9b8);
  ModelBin::~ModelBin((ModelBin *)&local_9b8);
  (*pLVar1->_vptr_Layer[4])(pLVar1,opt);
  (*pLVar1->_vptr_Layer[9])(pLVar1,m,opt);
  (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
  (*pLVar1->_vptr_Layer[1])(pLVar1);
  Mat::~Mat(weights);
  ParamDict::~ParamDict(&pd);
  return;
}

Assistant:

void dequantize_int32_to_float32(Mat& m, float scale, const float* bias, int bias_data_size, const Option& opt)
{
    Layer* dequantize = create_layer(LayerType::Dequantize);

    ParamDict pd;
    pd.set(0, scale);
    pd.set(1, bias ? 1 : 0);
    pd.set(2, bias_data_size);

    dequantize->load_param(pd);

    Mat weights[1];
    weights[0] = Mat(bias_data_size, (void*)bias);

    dequantize->load_model(ModelBinFromMatArray(weights));

    dequantize->create_pipeline(opt);

    dequantize->forward_inplace(m, opt);

    dequantize->destroy_pipeline(opt);

    delete dequantize;
}